

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoderTests.cpp
# Opt level: O0

void __thiscall
DecoderTestsFixture_failed_reserve_resources_Test::TestBody
          (DecoderTestsFixture_failed_reserve_resources_Test *this)

{
  bool bVar1;
  MockSpec<void_*(unsigned_long)> *this_00;
  TypedExpectation<void_*(unsigned_long)> *this_01;
  char *message;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int> *x;
  EqMatcher<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  *matcher;
  AssertHelper local_140;
  Message local_138;
  allocator local_129;
  string local_128;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_108;
  int local_dc;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_d8;
  EqMatcher<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  local_b0;
  PredicateFormatterFromMatcher<testing::internal::EqMatcher<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  local_88;
  undefined1 local_60 [8];
  AssertionResult gtest_ar;
  Action<void_*(unsigned_long)> local_48 [2];
  Matcher<unsigned_long> local_28;
  DecoderTestsFixture_failed_reserve_resources_Test *local_10;
  DecoderTestsFixture_failed_reserve_resources_Test *this_local;
  
  local_10 = this;
  testing::internal::AnythingMatcher::operator_cast_to_Matcher
            (&local_28,(AnythingMatcher *)&testing::_);
  this_00 = ResourceSystemMock::gmock_Resource_Reserve
                      (&(this->super_DecoderTestsFixture).rs,&local_28);
  this_01 = testing::internal::MockSpec<void_*(unsigned_long)>::InternalExpectedAt
                      (this_00,
                       "/workspace/llm4binary/github/license_c_cmakelists/CppCodeReviewers[P]How-to-mock-free-function/DecoderTests.cpp"
                       ,0x11,"rs","Resource_Reserve(_)");
  testing::Return<decltype(nullptr)>(&gtest_ar.message_);
  testing::internal::ReturnAction::operator_cast_to_Action((ReturnAction *)local_48);
  testing::internal::TypedExpectation<void_*(unsigned_long)>::WillRepeatedly(this_01,local_48);
  testing::Action<void_*(unsigned_long)>::~Action(local_48);
  testing::Matcher<unsigned_long>::~Matcher(&local_28);
  local_dc = -1;
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  pair<const_char_(&)[1],_int,_true>(&local_d8,(char (*) [1])0x1b469d,&local_dc);
  testing::Eq<std::pair<std::__cxx11::string,int>>(&local_b0,(testing *)&local_d8,x);
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::internal::EqMatcher<std::pair<std::__cxx11::string,int>>>
            (&local_88,(internal *)&local_b0,matcher);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_128,"message which needs too much resources",&local_129);
  Decoder::decode(&local_108,&local_128);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::EqMatcher<std::pair<std::__cxx11::string,int>>>::
  operator()(local_60,(char *)&local_88,
             (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
              *)"Decoder::decode(\"message which needs too much resources\")");
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  ~pair(&local_108);
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator((allocator<char> *)&local_129);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::EqMatcher<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~PredicateFormatterFromMatcher(&local_88);
  testing::internal::
  EqMatcher<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  ::~EqMatcher(&local_b0);
  std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::
  ~pair(&local_d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_60);
  if (!bVar1) {
    testing::Message::Message(&local_138);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_60);
    testing::internal::AssertHelper::AssertHelper
              (&local_140,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/CppCodeReviewers[P]How-to-mock-free-function/DecoderTests.cpp"
               ,0x13,message);
    testing::internal::AssertHelper::operator=(&local_140,&local_138);
    testing::internal::AssertHelper::~AssertHelper(&local_140);
    testing::Message::~Message(&local_138);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_60);
  return;
}

Assistant:

TEST_F(DecoderTestsFixture, failed_reserve_resources)
{
	EXPECT_CALL(rs, Resource_Reserve(_)).WillRepeatedly(Return(nullptr));

	ASSERT_THAT(Decoder::decode("message which needs too much resources"), Eq(ValueWithError("", -1)));
}